

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void receive_setup(void)

{
  _class *c;
  t_symbol *ptVar1;
  
  ptVar1 = gensym("receive");
  receive_class = class_new(ptVar1,receive_new,receive_free,0x38,8,A_DEFSYM,0);
  ptVar1 = gensym("r");
  class_addcreator(receive_new,ptVar1,A_DEFSYM,0);
  class_addbang(receive_class,receive_bang);
  class_doaddfloat(receive_class,receive_float);
  class_addsymbol(receive_class,receive_symbol);
  class_addpointer(receive_class,receive_pointer);
  class_addlist(receive_class,receive_list);
  class_addanything(receive_class,receive_anything);
  c = receive_class;
  ptVar1 = gensym("send-receive");
  class_sethelpsymbol(c,ptVar1);
  return;
}

Assistant:

static void receive_setup(void)
{
    receive_class = class_new(gensym("receive"), (t_newmethod)receive_new,
        (t_method)receive_free, sizeof(t_receive), CLASS_NOINLET, A_DEFSYM, 0);
    class_addcreator((t_newmethod)receive_new, gensym("r"), A_DEFSYM, 0);
    class_addbang(receive_class, receive_bang);
    class_addfloat(receive_class, (t_method)receive_float);
    class_addsymbol(receive_class, receive_symbol);
    class_addpointer(receive_class, receive_pointer);
    class_addlist(receive_class, receive_list);
    class_addanything(receive_class, receive_anything);
    class_sethelpsymbol(receive_class, gensym("send-receive"));
}